

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

If_Man_t * Gia_ManToIf(Gia_Man_t *p,If_Par_t *pPars)

{
  uint uVar1;
  char *__s;
  ulong uVar2;
  void **ppvVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  If_Man_t *p_01;
  size_t sVar8;
  char *__dest;
  ulong uVar9;
  If_Obj_t *pIVar10;
  int Fill;
  ulong uVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  
  Gia_ManChoiceLevel(p);
  if (p->pSibls != (int *)0x0) {
    Gia_ManMarkFanoutDrivers(p);
  }
  p_01 = If_ManStart(pPars);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  p_01->pName = __dest;
  if (1.0 < (double)p_01->nObjBytes * (double)p->nObjs * 9.313225746154785e-10) {
    printf(
          "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n"
          );
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = p_01->pConst1->Id;
  if (1 < p->nObjs) {
    uVar11 = 1;
    do {
      pGVar13 = p->pObjs + uVar11;
      uVar2 = *(ulong *)pGVar13;
      uVar7 = (uint)uVar2;
      uVar9 = uVar2 & 0x1fffffff;
      if (uVar9 == 0x1fffffff || (int)uVar7 < 0) {
        if ((~uVar7 & 0x9fffffff) == 0) {
          pIVar10 = If_ManCreateCi(p_01);
          pGVar6 = p->pObjs;
          if ((pGVar13 < pGVar6) || (pGVar6 + p->nObjs <= pGVar13)) {
LAB_006bca16:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar7 = (int)((long)pGVar13 - (long)pGVar6 >> 2) * -0x55555555;
          p_00 = p->vLevels;
          Vec_IntFillExtra(p_00,uVar7 + 1,Fill);
          if (((int)uVar7 < 0) || (p_00->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar7 = p_00->pArray[uVar7 & 0x7fffffff];
          *(uint *)pIVar10 = *(uint *)pIVar10 & 0x1fff | uVar7 << 0xd;
          uVar7 = uVar7 & 0x7ffff;
          if (p_01->nLevelMax < (int)uVar7) {
            p_01->nLevelMax = uVar7;
          }
        }
        else {
          if ((-1 < (int)uVar7) || ((int)uVar9 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                          ,0x315,"If_Man_t *Gia_ManToIf(Gia_Man_t *, If_Par_t *)");
          }
          uVar1 = pGVar13[-uVar9].Value;
          if (((long)(int)uVar1 < 0) || (p_01->vObjs->nSize <= (int)uVar1)) goto LAB_006bc9f7;
          pIVar10 = If_ManCreateCo(p_01,(If_Obj_t *)
                                        ((ulong)((~*(ulong *)(pGVar13 + -uVar9) & 0x1fffffff1fffffff
                                                 ) == 0) ^
                                        (ulong)(uVar7 >> 0x1d & 1) ^
                                        (ulong)p_01->vObjs->pArray[(int)uVar1]));
        }
      }
      else {
        uVar7 = pGVar13[-uVar9].Value;
        if ((long)(int)uVar7 < 0) goto LAB_006bc9f7;
        uVar1 = p_01->vObjs->nSize;
        if ((int)uVar1 <= (int)uVar7) goto LAB_006bc9f7;
        uVar12 = (uint)(uVar2 >> 0x20);
        uVar14 = pGVar13[-(ulong)(uVar12 & 0x1fffffff)].Value;
        if (((long)(int)uVar14 < 0) || (uVar1 <= uVar14)) goto LAB_006bc9f7;
        ppvVar3 = p_01->vObjs->pArray;
        pIVar10 = If_ManCreateAnd(p_01,(If_Obj_t *)
                                       ((ulong)((uint)(uVar2 >> 0x1d) & 1) ^
                                       (ulong)ppvVar3[(int)uVar7]),
                                  (If_Obj_t *)
                                  ((ulong)(uVar12 >> 0x1d & 1) ^ (ulong)ppvVar3[(int)uVar14]));
      }
      uVar7 = pIVar10->Id;
      if (uVar11 != uVar7) {
        __assert_fail("i == If_ObjId(pIfObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x316,"If_Man_t *Gia_ManToIf(Gia_Man_t *, If_Par_t *)");
      }
      pGVar13->Value = uVar7;
      piVar4 = p->pSibls;
      if (piVar4 != (int *)0x0) {
        uVar1 = piVar4[uVar11];
        if (((ulong)uVar1 != 0) && ((pGVar13->field_0x3 & 0x40) != 0)) {
          if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
LAB_006bca35:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((int)uVar7 < 0) {
LAB_006bc9f7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pVVar5 = p_01->vObjs;
          pGVar13 = p->pObjs + uVar1;
          uVar1 = pVVar5->nSize;
          uVar14 = uVar7;
          while( true ) {
            if ((int)uVar1 <= (int)uVar14) goto LAB_006bc9f7;
            uVar12 = pGVar13->Value;
            if (((long)(int)uVar12 < 0) || (uVar1 <= uVar12)) goto LAB_006bc9f7;
            *(void **)((long)pVVar5->pArray[uVar14] + 0x28) = pVVar5->pArray[(int)uVar12];
            pGVar6 = p->pObjs;
            if ((pGVar13 < pGVar6) || (pGVar6 + p->nObjs <= pGVar13)) goto LAB_006bca16;
            uVar14 = piVar4[(int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * -0x55555555];
            if ((ulong)uVar14 == 0) break;
            if (((int)uVar14 < 0) || (p->nObjs <= (int)uVar14)) goto LAB_006bca35;
            pGVar13 = pGVar6 + uVar14;
            uVar14 = uVar12;
            if ((int)uVar12 < 0) goto LAB_006bc9f7;
          }
          if (pVVar5->nSize <= (int)uVar7) goto LAB_006bc9f7;
          If_ManCreateChoice(p_01,(If_Obj_t *)pVVar5->pArray[uVar11]);
          pPars->fExpRed = 0;
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->nObjs);
  }
  if (p->pSibls != (int *)0x0) {
    Gia_ManCleanMark0(p);
  }
  return p_01;
}

Assistant:

If_Man_t * Gia_ManToIf( Gia_Man_t * p, If_Par_t * pPars )
{
    If_Man_t * pIfMan;
    If_Obj_t * pIfObj;
    Gia_Obj_t * pObj;
    int i;
    // create levels with choices
    Gia_ManChoiceLevel( p );
    // mark representative nodes
    if ( Gia_ManHasChoices(p) )
        Gia_ManMarkFanoutDrivers( p );
    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->pName = Abc_UtilStrsav( Gia_ManName(p) );
    // print warning about excessive memory usage
    if ( 1.0 * Gia_ManObjNum(p) * pIfMan->nObjBytes / (1<<30) > 1.0 )
        printf( "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n", 
            1.0 * Gia_ManObjNum(p) * pIfMan->nObjBytes / (1<<30), Gia_ManObjNum(p) );
    // load the AIG into the mapper
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = If_ObjId( If_ManConst1(pIfMan) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pIfObj = If_ManCreateAnd( pIfMan, If_ManFanin0Copy(pIfMan, pObj), If_ManFanin1Copy(pIfMan, pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pIfObj = If_ManCreateCi( pIfMan );
            If_ObjSetLevel( pIfObj, Gia_ObjLevel(p, pObj) );
//            Abc_Print( 1, "pi%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
            if ( pIfMan->nLevelMax < (int)pIfObj->Level )
                pIfMan->nLevelMax = (int)pIfObj->Level;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pIfObj = If_ManCreateCo( pIfMan, If_NotCond( If_ManFanin0Copy(pIfMan, pObj), Gia_ObjIsConst0(Gia_ObjFanin0(pObj))) );
//            Abc_Print( 1, "po%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else assert( 0 );
        assert( i == If_ObjId(pIfObj) );
        Gia_ObjSetValue( pObj, If_ObjId(pIfObj) );
        // set up the choice node
        if ( Gia_ObjSibl(p, i) && pObj->fMark0 )
        {
            Gia_Obj_t * pSibl, * pPrev;
            for ( pPrev = pObj, pSibl = Gia_ObjSiblObj(p, i); pSibl; pPrev = pSibl, pSibl = Gia_ObjSiblObj(p, Gia_ObjId(p, pSibl)) )
                If_ObjSetChoice( If_ManObj(pIfMan, Gia_ObjValue(pPrev)), If_ManObj(pIfMan, Gia_ObjValue(pSibl)) );
            If_ManCreateChoice( pIfMan, If_ManObj(pIfMan, Gia_ObjValue(pObj)) );
            pPars->fExpRed = 0;
        }
//        assert( If_ObjLevel(pIfObj) == Gia_ObjLevel(pNode) );
    }
    if ( Gia_ManHasChoices(p) )
        Gia_ManCleanMark0( p );
    return pIfMan;
}